

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int upsampled_obmc_pref_error
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              uint *sse)

{
  int iVar1;
  long *in_RCX;
  MV *in_RDX;
  MACROBLOCKD *in_RDI;
  undefined8 in_R8;
  uint8_t *pred8;
  uint8_t pred [32768];
  uint besterr;
  int mi_col;
  int mi_row;
  int subpel_y_q3;
  int subpel_x_q3;
  int ref_stride;
  uint8_t *ref;
  int32_t *mask;
  int32_t *wsrc;
  MSBuffers *ms_buffers;
  int h;
  int w;
  SUBPEL_SEARCH_TYPE subpel_search_type;
  aom_variance_fn_ptr_t *vfp;
  undefined1 local_80a8 [32776];
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  undefined4 local_8c;
  uint8_t *local_88;
  long local_80;
  long local_78;
  long *local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined1 local_59;
  long local_58;
  undefined8 local_50;
  MV *local_40;
  MACROBLOCKD *local_30;
  
  local_58 = *in_RCX;
  local_59 = (undefined1)in_RCX[1];
  local_60 = (undefined4)in_RCX[9];
  local_64 = *(undefined4 *)((long)in_RCX + 0x4c);
  local_70 = in_RCX + 2;
  local_78 = in_RCX[7];
  local_80 = in_RCX[8];
  local_50 = in_R8;
  local_40 = in_RDX;
  local_30 = in_RDI;
  local_88 = get_buf_from_mv((buf_2d *)*local_70,*in_RDX);
  local_8c = *(undefined4 *)(*local_70 + 0x18);
  local_90 = get_subpel_part((int)local_40->col);
  local_94 = get_subpel_part((int)local_40->row);
  local_98 = local_30->mi_row;
  local_9c = local_30->mi_col;
  iVar1 = is_cur_buf_hbd(local_30);
  if (iVar1 == 0) {
    aom_upsampled_pred_sse2
              ((MACROBLOCKD *)pred._4472_8_,(AV1Common *)pred._4464_8_,pred._4460_4_,pred._4456_4_,
               (MV *)pred._4448_8_,(uint8_t *)pred._4440_8_,pred._4656_4_,pred._4664_4_,
               pred._4672_4_,pred._4680_4_,(uint8_t *)pred._4688_8_,pred._4696_4_,pred._4704_4_);
    local_a0 = (**(code **)(local_58 + 0x60))(local_80a8,local_60,local_78,local_80,local_50);
  }
  else {
    aom_highbd_upsampled_pred_sse2
              ((MACROBLOCKD *)pred._8520_8_,(AV1Common *)pred._8512_8_,pred._8508_4_,pred._8504_4_,
               (MV *)pred._8496_8_,(uint8_t *)pred._8488_8_,pred._8736_4_,pred._8744_4_,
               pred._8752_4_,pred._8760_4_,(uint8_t *)pred._8768_8_,pred._8776_4_,pred._8784_4_,
               pred._8792_4_);
    local_a0 = (**(code **)(local_58 + 0x60))
                         ((ulong)local_80a8 >> 1,local_60,local_78,local_80,local_50);
  }
  return local_a0;
}

Assistant:

static int upsampled_obmc_pref_error(MACROBLOCKD *xd, const AV1_COMMON *cm,
                                     const MV *this_mv,
                                     const SUBPEL_SEARCH_VAR_PARAMS *var_params,
                                     unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const SUBPEL_SEARCH_TYPE subpel_search_type = var_params->subpel_search_type;
  const int w = var_params->w;
  const int h = var_params->h;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int ref_stride = ms_buffers->ref->stride;

  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  unsigned int besterr;
  DECLARE_ALIGNED(16, uint8_t, pred[2 * MAX_SB_SQUARE]);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    uint8_t *pred8 = CONVERT_TO_BYTEPTR(pred);
    aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred8, w, h,
                              subpel_x_q3, subpel_y_q3, ref, ref_stride, xd->bd,
                              subpel_search_type);
    besterr = vfp->ovf(pred8, w, wsrc, mask, sse);
  } else {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                       subpel_y_q3, ref, ref_stride, subpel_search_type);

    besterr = vfp->ovf(pred, w, wsrc, mask, sse);
  }
#else
  aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                     subpel_y_q3, ref, ref_stride, subpel_search_type);

  besterr = vfp->ovf(pred, w, wsrc, mask, sse);
#endif
  return besterr;
}